

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vacc(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint8_t es;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar2 = get_field1(s,FLD_O_m4,FLD_C_b4);
  bVar1 = (byte)iVar2;
  if (bVar1 < 5) {
    if (bVar1 == 4) {
      iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
      iVar3 = get_field1(s,FLD_O_v2,FLD_C_d4);
      iVar4 = get_field1(s,FLD_O_v3,FLD_C_i3);
      gen_gvec128_3_i64(tcg_ctx_00,gen_acc2_i64,(uint8_t)iVar2,(uint8_t)iVar3,(uint8_t)iVar4);
      s_local._4_4_ = DISAS_NEXT;
    }
    else {
      iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
      dofs = vec_full_reg_offset((uint8_t)iVar2);
      iVar2 = get_field1(s,FLD_O_v2,FLD_C_d4);
      aofs = vec_full_reg_offset((uint8_t)iVar2);
      iVar2 = get_field1(s,FLD_O_v3,FLD_C_i3);
      bofs = vec_full_reg_offset((uint8_t)iVar2);
      tcg_gen_gvec_3_s390x(tcg_ctx_00,dofs,aofs,bofs,0x10,0x10,op_vacc::g + bVar1);
      s_local._4_4_ = DISAS_NEXT;
    }
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_vacc(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = get_field(s, m4);
    static const GVecGen3 g[4] = {
        { .fni8 = gen_acc8_i64, },
        { .fni8 = gen_acc16_i64, },
        { .fni4 = gen_acc_i32, },
        { .fni8 = gen_acc_i64, },
    };

    if (es > ES_128) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    } else if (es == ES_128) {
        gen_gvec128_3_i64(tcg_ctx, gen_acc2_i64, get_field(s, v1),
                          get_field(s, v2), get_field(s, v3));
        return DISAS_NEXT;
    }
    gen_gvec_3(tcg_ctx, get_field(s, v1), get_field(s, v2),
               get_field(s, v3), &g[es]);
    return DISAS_NEXT;
}